

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_decoder.h
# Opt level: O0

exr_result_t
LossyDctDecoder_unRleAc
          (LossyDctDecoder *d,int *lastNonZero,uint16_t **currAcComp,uint16_t *packedAcEnd,
          uint16_t *halfZigBlock)

{
  ushort uVar1;
  uint local_58;
  uint8_t count;
  uint64_t ac_count;
  int lnz;
  uint16_t val;
  uint16_t *acComp;
  int dctComp;
  uint16_t *halfZigBlock_local;
  uint16_t *packedAcEnd_local;
  uint16_t **currAcComp_local;
  int *lastNonZero_local;
  LossyDctDecoder *d_local;
  
  dctComp = 1;
  acComp = *currAcComp;
  lnz = 0;
  ac_count = 0;
  while( true ) {
    if (0x3f < dctComp) {
      d->_packedAcCount = ac_count + d->_packedAcCount;
      *lastNonZero = lnz;
      *currAcComp = acComp;
      return 0;
    }
    if (packedAcEnd <= acComp) break;
    uVar1 = *acComp;
    if ((uVar1 & 0xff00) == 0xff00) {
      if ((byte)uVar1 == 0) {
        local_58 = 0x40;
      }
      else {
        local_58 = (uint)(byte)uVar1;
      }
      dctComp = local_58 + dctComp;
    }
    else {
      lnz = dctComp;
      halfZigBlock[dctComp] = uVar1;
      dctComp = dctComp + 1;
    }
    ac_count = ac_count + 1;
    acComp = acComp + 1;
  }
  return 0x17;
}

Assistant:

static inline exr_result_t
LossyDctDecoder_unRleAc (
    LossyDctDecoder* d,
    int*             lastNonZero,
    uint16_t**       currAcComp,
    uint16_t*        packedAcEnd,
    uint16_t*        halfZigBlock)
{
    //
    // Un-RLE the RLE'd blocks. If we find an item whose
    // high byte is 0xff, then insert the number of 0's
    // as indicated by the low byte.
    //
    // Otherwise, just copy the number verbatim.
    //
    int       dctComp = 1;
    uint16_t* acComp  = *currAcComp;
    uint16_t  val;
    int       lnz      = 0;
    uint64_t  ac_count = 0;

    //
    // Start with a zero'ed block, so we don't have to
    // write when we hit a run symbol
    //

    while (dctComp < 64)
    {
        if (acComp >= packedAcEnd) { return EXR_ERR_CORRUPT_CHUNK; }
        val = *acComp;
        if ((val & 0xff00) == 0xff00)
        {
            uint8_t count = val & 0xff;

            // run, insert 0s - since block pre-zeroed, nothing to do
            // just increment dctComp but test for end of block...
            dctComp += (count == 0) ? 64 : count;
        }
        else
        {
            //
            // Not a run, just copy over the value
            //
            lnz                   = dctComp;
            halfZigBlock[dctComp] = val;

            ++dctComp;
        }

        ++ac_count;
        ++acComp;
    }

    d->_packedAcCount += ac_count;
    *lastNonZero = lnz;
    *currAcComp  = acComp;
    return EXR_ERR_SUCCESS;
}